

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

void __thiscall t_rs_generator::render_attributes_and_includes(t_rs_generator *this)

{
  ofstream_with_content_based_conditional_update *poVar1;
  string *psVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  t_program *this_01;
  ostream *poVar3;
  _Base_ptr p_Var4;
  t_rs_generator *ptVar5;
  pointer pptVar6;
  pointer pptVar7;
  vector<t_service_*,_std::allocator<t_service_*>_> services;
  vector<t_program_*,_std::allocator<t_program_*>_> includes;
  set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  referenced_modules;
  string module_namespace;
  string module_name;
  allocator local_162;
  allocator local_161;
  ofstream_with_content_based_conditional_update *local_160;
  t_rs_generator *local_158;
  _Vector_base<t_service_*,_std::allocator<t_service_*>_> local_150;
  _Vector_base<t_program_*,_std::allocator<t_program_*>_> local_138;
  _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_120;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [128];
  
  poVar1 = &this->f_gen_;
  poVar3 = std::operator<<((ostream *)poVar1,"#![allow(unused_imports)]");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<((ostream *)poVar1,"#![allow(unused_extern_crates)]");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<((ostream *)poVar1,
                           "#![allow(clippy::too_many_arguments, clippy::type_complexity, clippy::vec_box)]"
                          );
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<((ostream *)poVar1,"#![cfg_attr(rustfmt, rustfmt_skip)]");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<((ostream *)poVar1,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<((ostream *)poVar1,"use std::cell::RefCell;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<((ostream *)poVar1,"use std::collections::{BTreeMap, BTreeSet};");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<((ostream *)poVar1,"use std::convert::{From, TryFrom};");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<((ostream *)poVar1,"use std::default::Default;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<((ostream *)poVar1,"use std::error::Error;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<((ostream *)poVar1,"use std::fmt;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<((ostream *)poVar1,"use std::fmt::{Display, Formatter};");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<((ostream *)poVar1,"use std::rc::Rc;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<((ostream *)poVar1,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<((ostream *)poVar1,"use thrift::OrderedFloat;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<((ostream *)poVar1,
                           "use thrift::{ApplicationError, ApplicationErrorKind, ProtocolError, ProtocolErrorKind, TThriftClient};"
                          );
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<((ostream *)poVar1,
                           "use thrift::protocol::{TFieldIdentifier, TListIdentifier, TMapIdentifier, TMessageIdentifier, TMessageType, TInputProtocol, TOutputProtocol, TSetIdentifier, TStructIdentifier, TType};"
                          );
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<((ostream *)poVar1,"use thrift::protocol::field_id;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<((ostream *)poVar1,"use thrift::protocol::verify_expected_message_type;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<((ostream *)poVar1,
                           "use thrift::protocol::verify_expected_sequence_number;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<((ostream *)poVar1,"use thrift::protocol::verify_expected_service_call;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<((ostream *)poVar1,"use thrift::protocol::verify_required_field_exists;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<((ostream *)poVar1,"use thrift::server::TProcessor;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  local_160 = poVar1;
  std::operator<<((ostream *)poVar1,(string *)&::endl_abi_cxx11_);
  local_120._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_120._M_impl.super__Rb_tree_header._M_header;
  local_120._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_120._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_120._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_158 = this;
  local_120._M_impl.super__Rb_tree_header._M_header._M_right =
       local_120._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<t_program_*,_std::allocator<t_program_*>_>::vector
            ((vector<t_program_*,_std::allocator<t_program_*>_> *)&local_138,
             &((this->super_t_generator).program_)->includes_);
  psVar2 = (string *)(local_b0 + 0x20);
  this_00 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_b0 + 0x40);
  for (pptVar6 = local_138._M_impl.super__Vector_impl_data._M_start; ptVar5 = local_158,
      pptVar6 != local_138._M_impl.super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    this_01 = *pptVar6;
    std::__cxx11::string::string((string *)psVar2,"rs",(allocator *)&local_f0);
    t_program::get_namespace(&local_d0,this_01,psVar2);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (this_00,&this_01->name_,&local_d0);
    std::
    _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&local_120,this_00);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(this_00);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)psVar2);
  }
  std::vector<t_service_*,_std::allocator<t_service_*>_>::vector
            ((vector<t_service_*,_std::allocator<t_service_*>_> *)&local_150,
             &((local_158->super_t_generator).program_)->services_);
  for (pptVar7 = local_150._M_impl.super__Vector_impl_data._M_start;
      pptVar7 != local_150._M_impl.super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
    compute_service_referenced_modules
              (ptVar5,*pptVar7,
               (set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_120);
  }
  if (local_120._M_impl.super__Rb_tree_header._M_node_count != 0) {
    psVar2 = (string *)(local_b0 + 0x40);
    for (p_Var4 = local_120._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &local_120._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      std::__cxx11::string::string((string *)psVar2,(string *)(p_Var4 + 1));
      std::__cxx11::string::string((string *)&local_d0,(string *)(p_Var4 + 2));
      std::__cxx11::string::string((string *)&local_f0,".",&local_161);
      ptVar5 = (t_rs_generator *)local_b0;
      std::__cxx11::string::string((string *)local_b0,"::",&local_162);
      string_replace(ptVar5,&local_d0,&local_f0,(string *)local_b0);
      std::__cxx11::string::~string((string *)local_b0);
      std::__cxx11::string::~string((string *)&local_f0);
      if (local_d0._M_string_length == 0) {
        poVar3 = std::operator<<((ostream *)local_160,"use crate::");
        rust_snake_case(&local_f0,local_158,psVar2);
        poVar3 = std::operator<<(poVar3,(string *)&local_f0);
        poVar3 = std::operator<<(poVar3,";");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      }
      else {
        poVar3 = std::operator<<((ostream *)local_160,"use crate::");
        poVar3 = std::operator<<(poVar3,(string *)&local_d0);
        poVar3 = std::operator<<(poVar3,"::");
        rust_snake_case(&local_f0,local_158,psVar2);
        poVar3 = std::operator<<(poVar3,(string *)&local_f0);
        poVar3 = std::operator<<(poVar3,";");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      }
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)psVar2);
    }
    std::operator<<((ostream *)local_160,(string *)&::endl_abi_cxx11_);
  }
  std::_Vector_base<t_service_*,_std::allocator<t_service_*>_>::~_Vector_base(&local_150);
  std::_Vector_base<t_program_*,_std::allocator<t_program_*>_>::~_Vector_base(&local_138);
  std::
  _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_120);
  return;
}

Assistant:

void t_rs_generator::render_attributes_and_includes() {
  // turn off some compiler/clippy warnings

  // code always includes BTreeMap/BTreeSet/OrderedFloat
  f_gen_ << "#![allow(unused_imports)]" << endl;
  // code might not include imports from crates
  f_gen_ << "#![allow(unused_extern_crates)]" << endl;
  // constructors take *all* struct parameters, which can trigger the "too many arguments" warning
  // some auto-gen'd types can be deeply nested. clippy recommends factoring them out which is hard to autogen
  // FIXME: re-enable the 'vec_box' lint see: [THRIFT-5364](https://issues.apache.org/jira/browse/THRIFT-5364)
  // This can happen because we automatically generate a Vec<Box<Type>> when the type is a typedef
  // and it's a forward typedef. This (typedef + forward typedef) can happen in two situations:
  // 1. When the type is recursive
  // 2. When you define types out of order
  f_gen_ << "#![allow(clippy::too_many_arguments, clippy::type_complexity, clippy::vec_box)]" << endl;
  // prevent rustfmt from running against this file
  // lines are too long, code is (thankfully!) not visual-indented, etc.
  // can't use #[rustfmt::skip] see: https://github.com/rust-lang/rust/issues/54726
  f_gen_ << "#![cfg_attr(rustfmt, rustfmt_skip)]" << endl;
  f_gen_ << endl;

  // add standard includes
  f_gen_ << "use std::cell::RefCell;" << endl;
  f_gen_ << "use std::collections::{BTreeMap, BTreeSet};" << endl;
  f_gen_ << "use std::convert::{From, TryFrom};" << endl;
  f_gen_ << "use std::default::Default;" << endl;
  f_gen_ << "use std::error::Error;" << endl;
  f_gen_ << "use std::fmt;" << endl;
  f_gen_ << "use std::fmt::{Display, Formatter};" << endl;
  f_gen_ << "use std::rc::Rc;" << endl;
  f_gen_ << endl;
  f_gen_ << "use thrift::OrderedFloat;" << endl;
  f_gen_ << "use thrift::{ApplicationError, ApplicationErrorKind, ProtocolError, ProtocolErrorKind, TThriftClient};" << endl;
  f_gen_ << "use thrift::protocol::{TFieldIdentifier, TListIdentifier, TMapIdentifier, TMessageIdentifier, TMessageType, TInputProtocol, TOutputProtocol, TSetIdentifier, TStructIdentifier, TType};" << endl;
  f_gen_ << "use thrift::protocol::field_id;" << endl;
  f_gen_ << "use thrift::protocol::verify_expected_message_type;" << endl;
  f_gen_ << "use thrift::protocol::verify_expected_sequence_number;" << endl;
  f_gen_ << "use thrift::protocol::verify_expected_service_call;" << endl;
  f_gen_ << "use thrift::protocol::verify_required_field_exists;" << endl;
  f_gen_ << "use thrift::server::TProcessor;" << endl;
  f_gen_ << endl;

  // add all the program includes
  // NOTE: this is more involved than you would expect because of service extension
  // Basically, I have to find the closure of all the services and include their modules at the top-level

  set<pair<string, string>> referenced_modules; // set<module, namespace>

  // first, start by adding explicit thrift includes
  const vector<t_program*> includes = get_program()->get_includes();
  vector<t_program*>::const_iterator includes_iter;
  for(includes_iter = includes.begin(); includes_iter != includes.end(); ++includes_iter) {
    referenced_modules.insert(std::make_pair((*includes_iter)->get_name(), (*includes_iter)->get_namespace("rs")));
  }

  // next, recursively iterate through all the services and add the names of any programs they reference
  const vector<t_service*> services = get_program()->get_services();
  vector<t_service*>::const_iterator service_iter;
  for (service_iter = services.begin(); service_iter != services.end(); ++service_iter) {
    compute_service_referenced_modules(*service_iter, referenced_modules);
  }

  // finally, write all the "pub use..." declarations
  if (!referenced_modules.empty()) {
    set<pair<string, string>>::iterator module_iter;
    for (module_iter = referenced_modules.begin(); module_iter != referenced_modules.end(); ++module_iter) {
      string module_name((*module_iter).first);

      string module_namespace((*module_iter).second);
      string_replace(module_namespace, ".", "::");

      if (module_namespace.empty()) {
        f_gen_ << "use crate::" << rust_snake_case(module_name) << ";" << endl;
      } else {
        f_gen_ << "use crate::" << module_namespace << "::" << rust_snake_case(module_name) << ";" << endl;
      }
    }
    f_gen_ << endl;
  }
}